

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GenerateOutput
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files,OutputDirective *output_directive,GeneratorContext *generator_context)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char *pcVar3;
  short *psVar4;
  bool bVar5;
  int iVar6;
  Edition minimum_edition;
  Edition maximum_edition;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar7;
  CommandLineInterface *this_00;
  char *in_R9;
  string_view str;
  string_view plugin_prefix;
  string_view directive;
  string parameters;
  string parameters_1;
  string error;
  string local_a8;
  string local_88;
  string local_68;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_48;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  if (output_directive->generator == (CodeGenerator *)0x0) {
    pcVar3 = (char *)(output_directive->name)._M_string_length;
    if (((pcVar3 < (char *)0x2) ||
        (psVar4 = (short *)(output_directive->name)._M_dataplus._M_p,
        pcVar3 < (char *)0x4 || *psVar4 != 0x2d2d)) ||
       (*(int *)((long)(psVar4 + -2) + (long)pcVar3) != 0x74756f5f)) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                 ,0xa5d,
                 "absl::StartsWith(output_directive.name, \"--\") && absl::EndsWith(output_directive.name, \"_out\")"
                );
      str._M_str = "Bad name for plugin generator: ";
      str._M_len = 0x1f;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                ((LogMessage *)&local_a8,str);
      absl::lts_20250127::log_internal::LogMessage::operator<<
                ((LogMessage *)&local_a8,&output_directive->name);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_a8);
    }
    plugin_prefix._M_str = pcVar3;
    plugin_prefix._M_len = (size_t)(this->plugin_prefix_)._M_dataplus._M_p;
    directive._M_str = in_R9;
    directive._M_len = (size_t)psVar4;
    compiler::(anonymous_namespace)::PluginName_abi_cxx11_
              (&local_a8,(_anonymous_namespace_ *)(this->plugin_prefix_)._M_string_length,
               plugin_prefix,directive);
    paVar1 = &local_88.field_2;
    pcVar2 = (output_directive->parameter)._M_dataplus._M_p;
    local_88._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar2,pcVar2 + (output_directive->parameter)._M_string_length);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::try_emplace_impl<std::__cxx11::string_const&>(&local_48,&this->plugin_parameters_,&local_a8);
    if (*(long *)((long)local_48.first.field_1.slot_ + 0x28) != 0) {
      if (local_88._M_string_length != 0) {
        std::__cxx11::string::append((char *)&local_88);
      }
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::try_emplace_impl<std::__cxx11::string_const&>(&local_48,&this->plugin_parameters_,&local_a8)
      ;
      std::__cxx11::string::_M_append
                ((char *)&local_88,*(ulong *)((long)local_48.first.field_1.slot_ + 0x20));
    }
    bVar5 = GeneratePluginOutput(this,parsed_files,&local_a8,&local_88,generator_context,&local_68);
    if (bVar5) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
LAB_001dacc9:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      bVar5 = true;
      goto LAB_001daded;
    }
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(output_directive->name)._M_dataplus._M_p,
                        (output_directive->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    pcVar2 = (output_directive->parameter)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,pcVar2,pcVar2 + (output_directive->parameter)._M_string_length);
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::try_emplace_impl<std::__cxx11::string_const&>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                *)&local_88,&this->generator_parameters_,&output_directive->name);
    if (*(long *)(local_88._M_string_length + 0x28) != 0) {
      if (local_a8._M_string_length != 0) {
        std::__cxx11::string::append((char *)&local_a8);
      }
      absl::lts_20250127::container_internal::
      raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::try_emplace_impl<std::__cxx11::string_const&>
                ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
                  *)&local_88,&this->generator_parameters_,&output_directive->name);
      std::__cxx11::string::_M_append
                ((char *)&local_a8,*(ulong *)(local_88._M_string_length + 0x20));
    }
    this_00 = (CommandLineInterface *)output_directive->generator;
    iVar6 = (**(_func_int **)((long)(this_00->executable_name_)._M_dataplus._M_p + 0x20))();
    bVar5 = EnforceProto3OptionalSupport
                      (this_00,&output_directive->name,CONCAT44(extraout_var,iVar6),parsed_files);
    if (bVar5) {
      iVar6 = (*output_directive->generator->_vptr_CodeGenerator[4])();
      minimum_edition = (*output_directive->generator->_vptr_CodeGenerator[7])();
      maximum_edition = (*output_directive->generator->_vptr_CodeGenerator[8])();
      bVar5 = EnforceEditionsSupport
                        (this,&output_directive->name,CONCAT44(extraout_var_00,iVar6),
                         minimum_edition,maximum_edition,parsed_files);
      if (bVar5) {
        iVar6 = (*output_directive->generator->_vptr_CodeGenerator[3])
                          (output_directive->generator,parsed_files,&local_a8,generator_context,
                           &local_68);
        if ((char)iVar6 != '\0') goto LAB_001dacc9;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(output_directive->name)._M_dataplus._M_p,
                            (output_directive->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_68._M_dataplus._M_p,local_68._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  bVar5 = false;
LAB_001daded:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return bVar5;
}

Assistant:

bool CommandLineInterface::GenerateOutput(
    const std::vector<const FileDescriptor*>& parsed_files,
    const OutputDirective& output_directive,
    GeneratorContext* generator_context) {
  // Call the generator.
  std::string error;
  if (output_directive.generator == nullptr) {
    // This is a plugin.
    ABSL_CHECK(absl::StartsWith(output_directive.name, "--") &&
               absl::EndsWith(output_directive.name, "_out"))
        << "Bad name for plugin generator: " << output_directive.name;

    std::string plugin_name = PluginName(plugin_prefix_, output_directive.name);
    std::string parameters = output_directive.parameter;
    if (!plugin_parameters_[plugin_name].empty()) {
      if (!parameters.empty()) {
        parameters.append(",");
      }
      parameters.append(plugin_parameters_[plugin_name]);
    }
    if (!GeneratePluginOutput(parsed_files, plugin_name, parameters,
                              generator_context, &error)) {
      std::cerr << output_directive.name << ": " << error << std::endl;
      return false;
    }
  } else {
    // Regular generator.
    std::string parameters = output_directive.parameter;
    if (!generator_parameters_[output_directive.name].empty()) {
      if (!parameters.empty()) {
        parameters.append(",");
      }
      parameters.append(generator_parameters_[output_directive.name]);
    }
    if (!EnforceProto3OptionalSupport(
            output_directive.name,
            output_directive.generator->GetSupportedFeatures(), parsed_files)) {
      return false;
    }

    if (!EnforceEditionsSupport(
            output_directive.name,
            output_directive.generator->GetSupportedFeatures(),
            output_directive.generator->GetMinimumEdition(),
            output_directive.generator->GetMaximumEdition(), parsed_files)) {
      return false;
    }

    if (!output_directive.generator->GenerateAll(parsed_files, parameters,
                                                 generator_context, &error)) {
      // Generator returned an error.
      std::cerr << output_directive.name << ": " << error << std::endl;
      return false;
    }
  }

  return true;
}